

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O2

void __thiscall
cnn::Hinge::backward_impl
          (Hinge *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx,Tensor *dEdf,uint i,Tensor *dEdxi)

{
  float fVar1;
  uint uVar2;
  void *pvVar3;
  undefined1 auVar4 [16];
  Scalar *pSVar5;
  int iVar6;
  uint i_1;
  ulong index;
  undefined1 in_XMM2 [16];
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_50;
  
  if (i == 0) {
    if (*fx->v != 0.0) {
      uVar2 = (dEdxi->d).d[0];
      pvVar3 = (this->super_Node).aux_mem;
      iVar6 = 0;
      fVar1 = *dEdf->v;
      for (index = 0; uVar2 != index; index = index + 1) {
        if (0.0 < *(float *)((long)pvVar3 + index * 4)) {
          Tensor::operator*(&local_50,dEdxi);
          pSVar5 = Eigen::
                   DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
                   ::operator()((DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                 *)&local_50,index);
          iVar6 = iVar6 + 1;
          *pSVar5 = fVar1 + *pSVar5;
        }
      }
      auVar4 = vcvtusi2ss_avx512f(in_XMM2,iVar6);
      Tensor::operator*(&local_50,dEdxi);
      pSVar5 = Eigen::
               DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
               ::operator()((DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                             *)&local_50,(ulong)*this->pelement);
      auVar4 = vfnmadd213ss_fma(ZEXT416(auVar4._0_4_),ZEXT416((uint)fVar1),ZEXT416((uint)*pSVar5));
      *pSVar5 = auVar4._0_4_;
    }
    return;
  }
  __assert_fail("i == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/nodes.cc"
                ,0x4ea,
                "virtual void cnn::Hinge::backward_impl(const vector<const Tensor *> &, const Tensor &, const Tensor &, unsigned int, Tensor &) const"
               );
}

Assistant:

void Hinge::backward_impl(const vector<const Tensor*>& xs,
                       const Tensor& fx,
                       const Tensor& dEdf,
                       unsigned i,
                       Tensor& dEdxi) const {
  assert(i == 0);
#ifdef HAVE_CUDA
  throw std::runtime_error("Hinge not yet implemented for CUDA");
#else
  if (fx.v[0]) { // there was some loss
    const float d = dEdf.v[0];
    const unsigned rows = dEdxi.d.rows();
    const float* eloss = static_cast<const float*>(aux_mem);
    unsigned tne = 0;  // total number of errors
    for (unsigned i = 0; i < rows; ++i)
      if (eloss[i] > 0) {
        (*dEdxi)(i) += d;
        ++tne;
      }
    (*dEdxi)(*pelement) -= d * tne;
  }
#endif
}